

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O0

QByteArray * __thiscall QMetaPropertyBuilder::name(QMetaPropertyBuilder *this)

{
  QMetaPropertyBuilderPrivate *pQVar1;
  QByteArray *in_RDI;
  QMetaPropertyBuilderPrivate *d;
  QByteArray *this_00;
  QMetaPropertyBuilder *in_stack_ffffffffffffffe8;
  
  this_00 = in_RDI;
  pQVar1 = d_func(in_stack_ffffffffffffffe8);
  if (pQVar1 == (QMetaPropertyBuilderPrivate *)0x0) {
    QByteArray::QByteArray((QByteArray *)0x37902e);
  }
  else {
    QByteArray::QByteArray(this_00,in_RDI);
  }
  return this_00;
}

Assistant:

QByteArray QMetaPropertyBuilder::name() const
{
    QMetaPropertyBuilderPrivate *d = d_func();
    if (d)
        return d->name;
    else
        return QByteArray();
}